

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checking.cc
# Opt level: O2

bool __thiscall
dtc::fdt::checking::property_checker::check_property
          (property_checker *this,device_tree *tree,node_ptr *n,property_ptr *p)

{
  __type _Var1;
  int iVar2;
  bool bVar3;
  __shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  _Var1 = std::operator==(&((p->super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr)->key,&this->key);
  bVar3 = true;
  if (_Var1) {
    std::__shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,&p->super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>);
    iVar2 = (*(this->super_checker)._vptr_checker[4])(this,tree,n,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    if ((char)iVar2 == '\0') {
      checker::report_error(&this->super_checker,"property check failed");
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool
property_checker::check_property(device_tree *tree, const node_ptr &n, property_ptr p)
{
	if (p->get_key() == key)
	{
		if (!check(tree, n, p))
		{
			report_error("property check failed");
			return false;
		}
	}
	return true;
}